

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::ProfiledNewInstanceNoArg
              (RecyclableObject *function,ScriptContext *scriptContext,ArrayCallSiteInfo *arrayInfo,
              RecyclerWeakReference<Js::FunctionBody> *weakFuncRef)

{
  bool bVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  JavascriptFunction *pJVar5;
  undefined4 *puVar6;
  JavascriptNativeArray *this;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  bVar4 = VarIsImpl<Js::JavascriptFunction>(function);
  if (bVar4) {
    pJVar5 = VarTo<Js::JavascriptFunction,Js::RecyclableObject>(function);
    if ((pJVar5->functionInfo).ptr != (FunctionInfo *)EntryInfo::NewInstance) goto LAB_00b7c839;
  }
  else {
LAB_00b7c839:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x532,
                                "(VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo() == &JavascriptArray::EntryInfo::NewInstance)"
                                ,
                                "VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo() == &JavascriptArray::EntryInfo::NewInstance"
                               );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  if (((arrayInfo->field_0).bits & 1) == 0) {
    bVar4 = Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayPhase);
    if (!bVar4) {
      this = &JavascriptLibrary::CreateNativeIntArray
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptNativeArray;
      JavascriptNativeArray::SetArrayProfileInfo(this,weakFuncRef,arrayInfo);
      goto LAB_00b7c913;
    }
  }
  if (((arrayInfo->field_0).bits & 2) == 0) {
    bVar4 = Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayPhase);
    if (!bVar4) {
      this = &JavascriptLibrary::CreateNativeFloatArray
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptNativeArray;
      JavascriptNativeArray::SetArrayProfileInfo(this,weakFuncRef,arrayInfo);
      goto LAB_00b7c913;
    }
  }
  this = (JavascriptNativeArray *)
         JavascriptLibrary::CreateArray((scriptContext->super_ScriptContextBase).javascriptLibrary);
LAB_00b7c913:
  pTVar2->noJsReentrancy = bVar1;
  return this;
}

Assistant:

Var JavascriptArray::ProfiledNewInstanceNoArg(RecyclableObject *function, ScriptContext *scriptContext, ArrayCallSiteInfo *arrayInfo, RecyclerWeakReference<FunctionBody> *weakFuncRef)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrArr_ProfiledNewInstanceNoArg, reentrancylock, scriptContext->GetThreadContext());
        Assert(VarIs<JavascriptFunction>(function) &&
               VarTo<JavascriptFunction>(function)->GetFunctionInfo() == &JavascriptArray::EntryInfo::NewInstance);

        if (arrayInfo->IsNativeIntArray())
        {
            JavascriptNativeIntArray *arr = scriptContext->GetLibrary()->CreateNativeIntArray();
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);
            return arr;
        }

        if (arrayInfo->IsNativeFloatArray())
        {
            JavascriptNativeFloatArray *arr = scriptContext->GetLibrary()->CreateNativeFloatArray();
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);
            return arr;
        }

        return scriptContext->GetLibrary()->CreateArray();
        JIT_HELPER_END(ScrArr_ProfiledNewInstanceNoArg);
    }